

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void swap_endianness<long>(long *ptr,size_t n_els)

{
  bool bVar1;
  
  while (bVar1 = n_els != 0, n_els = n_els - 1, bVar1) {
    swap64b((char *)ptr);
    ptr = ptr + 1;
  }
  return;
}

Assistant:

void swap_endianness(dtype *ptr, size_t n_els) noexcept
{
    #ifndef __GNUC__
    if (std::is_same<dtype, size_t>::value)
    {
        for (size_t ix = 0; ix < n_els; ix++)
            endian_swap_size_t((char*)&ptr[ix]);
        return;
    }

    else if (std::is_same<dtype, int>::value)
    {
        for (size_t ix = 0; ix < n_els; ix++)
            endian_swap_int((char*)&ptr[ix]);
        return;
    }
    #endif

    for (size_t ix = 0; ix < n_els; ix++)
        endian_swap(ptr[ix]);
}